

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O0

ktx_error_code_e
ktxTexture_CreateFromStdioStream
          (FILE *stdioStream,ktxTextureCreateFlags createFlags,ktxTexture **newTex)

{
  long in_RDX;
  undefined4 in_ESI;
  FILE *in_RDI;
  ktx_error_code_e result;
  ktxStream stream;
  ktx_error_code_e local_8c;
  ktxTexture **in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  ktx_error_code_e local_4;
  
  if ((in_RDI == (FILE *)0x0) || (in_RDX == 0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    local_8c = ktxFileStream_construct((ktxStream *)&stack0xffffffffffffff78,in_RDI,false);
    if (local_8c == KTX_SUCCESS) {
      local_8c = ktxTexture_CreateFromStream
                           ((ktxStream *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                            (ktxTextureCreateFlags)((ulong)in_RDX >> 0x20),in_stack_ffffffffffffffd8
                           );
    }
    local_4 = local_8c;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture_CreateFromStdioStream(FILE* stdioStream,
                                 ktxTextureCreateFlags createFlags,
                                 ktxTexture** newTex)
{
    ktxStream stream;
    KTX_error_code result;

    if (stdioStream == NULL || newTex == NULL)
        return KTX_INVALID_VALUE;

    result = ktxFileStream_construct(&stream, stdioStream, KTX_FALSE);
    if (result == KTX_SUCCESS) {
        result = ktxTexture_CreateFromStream(&stream, createFlags, newTex);
    }
    return result;
}